

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::Clear(ImDrawList *this)

{
  ImVector<ImDrawCmd> *in_RDI;
  int in_stack_ffffffffffffffec;
  int new_size;
  
  ImVector<ImDrawCmd>::resize(in_RDI,in_stack_ffffffffffffffec);
  ImVector<unsigned_int>::resize((ImVector<unsigned_int> *)in_RDI,in_stack_ffffffffffffffec);
  ImVector<ImDrawVert>::resize((ImVector<ImDrawVert> *)in_RDI,in_stack_ffffffffffffffec);
  if (in_RDI[3].Data == (ImDrawCmd *)0x0) {
    new_size = 0;
  }
  else {
    new_size = *(int *)((long)&(in_RDI[3].Data)->UserCallback + 4);
  }
  in_RDI[3].Size = new_size;
  *(undefined4 *)&in_RDI[4].Data = 0;
  *(undefined4 *)((long)&in_RDI[4].Data + 4) = 0;
  in_RDI[5].Size = 0;
  in_RDI[5].Capacity = 0;
  in_RDI[5].Data = (ImDrawCmd *)0x0;
  ImVector<ImVec4>::resize((ImVector<ImVec4> *)in_RDI,new_size);
  ImVector<void_*>::resize((ImVector<void_*> *)in_RDI,new_size);
  ImVector<ImVec2>::resize((ImVector<ImVec2> *)in_RDI,new_size);
  ImDrawListSplitter::Clear((ImDrawListSplitter *)(in_RDI + 9));
  return;
}

Assistant:

void ImDrawList::Clear()
{
    CmdBuffer.resize(0);
    IdxBuffer.resize(0);
    VtxBuffer.resize(0);
    Flags = _Data ? _Data->InitialFlags : ImDrawListFlags_None;
    _VtxCurrentOffset = 0;
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.resize(0);
    _TextureIdStack.resize(0);
    _Path.resize(0);
    _Splitter.Clear();
}